

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface_p.h
# Opt level: O1

void __thiscall QFutureInterfaceBasePrivate::Data::setException(Data *this,exception_ptr *e)

{
  long in_FS_OFFSET;
  void *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivate::ResultStoreBase::~ResultStoreBase((ResultStoreBase *)this);
  *(undefined8 *)this = 0;
  local_20 = e->_M_exception_object;
  if (local_20 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  QtPrivate::ExceptionStore::setException((ExceptionStore *)this,(exception_ptr)&local_20);
  if (local_20 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setException(const std::exception_ptr &e)
        {
            m_results.~ResultStoreBase();
            new (&m_exceptionStore) QtPrivate::ExceptionStore();
            m_exceptionStore.setException(e);
        }